

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

void __thiscall mkvparser::ContentEncoding::~ContentEncoding(ContentEncoding *this)

{
  undefined8 *puVar1;
  void *pvVar2;
  undefined8 *puVar3;
  undefined8 *in_RDI;
  ContentEncryption *enc;
  ContentEncryption **enc_j;
  ContentEncryption **enc_i;
  ContentCompression *comp;
  ContentCompression **comp_j;
  ContentCompression **comp_i;
  ContentCompression *in_stack_ffffffffffffffa0;
  ContentEncryption *this_00;
  undefined8 *local_28;
  undefined8 *local_10;
  
  puVar1 = (undefined8 *)in_RDI[1];
  local_10 = (undefined8 *)*in_RDI;
  while (local_10 != puVar1) {
    puVar3 = local_10 + 1;
    pvVar2 = (void *)*local_10;
    local_10 = puVar3;
    if (pvVar2 != (void *)0x0) {
      ContentCompression::~ContentCompression(in_stack_ffffffffffffffa0);
      operator_delete(pvVar2);
    }
  }
  this_00 = (ContentEncryption *)*in_RDI;
  if (this_00 != (ContentEncryption *)0x0) {
    operator_delete__(this_00);
  }
  puVar1 = (undefined8 *)in_RDI[3];
  local_28 = (undefined8 *)in_RDI[2];
  while (local_28 != puVar1) {
    puVar3 = local_28 + 1;
    pvVar2 = (void *)*local_28;
    local_28 = puVar3;
    if (pvVar2 != (void *)0x0) {
      ContentEncryption::~ContentEncryption(this_00);
      operator_delete(pvVar2);
    }
  }
  if ((void *)in_RDI[2] != (void *)0x0) {
    operator_delete__((void *)in_RDI[2]);
  }
  return;
}

Assistant:

ContentEncoding::~ContentEncoding() {
  ContentCompression** comp_i = compression_entries_;
  ContentCompression** const comp_j = compression_entries_end_;

  while (comp_i != comp_j) {
    ContentCompression* const comp = *comp_i++;
    delete comp;
  }

  delete[] compression_entries_;

  ContentEncryption** enc_i = encryption_entries_;
  ContentEncryption** const enc_j = encryption_entries_end_;

  while (enc_i != enc_j) {
    ContentEncryption* const enc = *enc_i++;
    delete enc;
  }

  delete[] encryption_entries_;
}